

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

void __thiscall
cmFindLibraryHelper::DebugLibraryFound(cmFindLibraryHelper *this,string *name,string *path)

{
  string regexName;
  string sStack_b8;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  if (this->DebugMode == true) {
    local_48.View_._M_str = (this->PrefixRegexStr)._M_dataplus._M_p;
    local_48.View_._M_len = (this->PrefixRegexStr)._M_string_length;
    local_78.View_._M_str = (name->_M_dataplus)._M_p;
    local_78.View_._M_len = name->_M_string_length;
    cmStrCat<std::__cxx11::string>(&local_98,&local_48,&local_78,&this->SuffixRegexStr);
    std::__cxx11::string::string((string *)&sStack_b8,(string *)&local_98);
    cmFindBaseDebugState::FoundAt(&this->DebugSearches,path,&sStack_b8);
    std::__cxx11::string::~string((string *)&sStack_b8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void DebugLibraryFound(std::string const& name, std::string const& path)
  {
    if (this->DebugMode) {
      auto regexName =
        cmStrCat(this->PrefixRegexStr, name, this->SuffixRegexStr);
      this->DebugSearches.FoundAt(path, regexName);
    }
  }